

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::SetCompositionWindowPosition(CInput *this,float X,float Y,float H)

{
  long in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  SDL_Rect Rect;
  int local_18;
  int local_14;
  undefined4 local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fVar1 = IGraphics::ScreenHiDPIScale(*(IGraphics **)(in_RDI + 0x1218));
  local_18 = (int)(in_XMM0_Da / fVar1);
  fVar1 = IGraphics::ScreenHiDPIScale(*(IGraphics **)(in_RDI + 0x1218));
  local_14 = (int)(in_XMM1_Da / fVar1);
  fVar1 = IGraphics::ScreenHiDPIScale(*(IGraphics **)(in_RDI + 0x1218));
  local_c = (int)(in_XMM2_Da / fVar1);
  local_10 = 0;
  SDL_SetTextInputRect(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CInput::SetCompositionWindowPosition(float X, float Y, float H)
{
	SDL_Rect Rect;
	Rect.x = X / m_pGraphics->ScreenHiDPIScale();
	Rect.y = Y / m_pGraphics->ScreenHiDPIScale();
	Rect.h = H / m_pGraphics->ScreenHiDPIScale();
	Rect.w = 0;
	SDL_SetTextInputRect(&Rect);
}